

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O2

string * __thiscall
cfd::api::json::
ExecuteDirectApi<cfd::api::json::DecodeRawTransactionRequest,cfd::api::json::DecodeRawTransactionResponse>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
          *function)

{
  DecodeRawTransactionResponse response;
  DecodeRawTransactionRequest req;
  
  DecodeRawTransactionRequest::DecodeRawTransactionRequest(&req);
  core::JsonClassBase<cfd::api::json::DecodeRawTransactionRequest>::Deserialize
            (&req.super_JsonClassBase<cfd::api::json::DecodeRawTransactionRequest>,(string *)this);
  DecodeRawTransactionResponse::DecodeRawTransactionResponse(&response);
  std::
  function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
  ::operator()((function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
                *)request_message,&req,&response);
  core::JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>::Serialize_abi_cxx11_
            (__return_storage_ptr__,
             &response.super_JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>);
  DecodeRawTransactionResponse::~DecodeRawTransactionResponse(&response);
  DecodeRawTransactionRequest::~DecodeRawTransactionRequest(&req);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    throw cfd_except;
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    throw ex;
  }

  ResponseType response;
  function(&req, &response);
  return response.Serialize();
}